

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropagatorTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::propagation::Propagator_testBinaryPropagation_Test::TestBody
          (Propagator_testBinaryPropagation_Test *this)

{
  bool bVar1;
  result_type rVar2;
  result_type_conflict rVar3;
  mapped_type *this_00;
  result_type_conflict rVar4;
  char *pcVar5;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *extraout_RDX;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *gen;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *gen_00;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *extraout_RDX_00;
  AssertHelper local_17b0 [8];
  Message local_17a8 [8];
  SpanContext local_17a0;
  undefined1 local_16f0 [8];
  AssertionResult gtest_ar;
  string local_16d8;
  TraceID local_16b8;
  undefined1 local_16a8 [8];
  SpanContext ctx;
  string value;
  string key;
  size_t i;
  StrMap baggage;
  result_type_conflict numBaggageItems;
  int kMaxNumBaggageItems;
  default_random_engine engine;
  random_device randomDevice;
  shared_ptr<jaegertracing::metrics::Metrics> local_1c8;
  undefined1 local_1b8 [8];
  BinaryPropagator binaryPropagator;
  stringstream ss;
  ostream local_188 [376];
  Propagator_testBinaryPropagation_Test *local_10;
  Propagator_testBinaryPropagation_Test *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream
            ((stringstream *)
             &binaryPropagator._metrics.
              super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<jaegertracing::metrics::Metrics>::shared_ptr(&local_1c8);
  BinaryPropagator::BinaryPropagator((BinaryPropagator *)local_1b8,&local_1c8);
  std::shared_ptr<jaegertracing::metrics::Metrics>::~shared_ptr(&local_1c8);
  std::random_device::random_device((random_device *)&engine);
  rVar2 = std::random_device::operator()((random_device *)&engine);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             &stack0xffffffffffffea98,(ulong)rVar2);
  rVar3 = std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::operator()
                    ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                     &stack0xffffffffffffea98);
  baggage._M_h._M_single_bucket = (__node_base_ptr)(rVar3 % 9 + 1);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&i);
  gen = extraout_RDX;
  for (key.field_2._8_8_ = 0; (ulong)key.field_2._8_8_ < baggage._M_h._M_single_bucket;
      key.field_2._8_8_ = key.field_2._8_8_ + 1) {
    (anonymous_namespace)::
    randomStr<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
              ((string *)((long)&value.field_2 + 8),
               (_anonymous_namespace_ *)&stack0xffffffffffffea98,gen);
    (anonymous_namespace)::
    randomStr<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
              ((string *)&ctx._mutex.super___mutex_base._M_mutex.__data.__list.__next,
               (_anonymous_namespace_ *)&stack0xffffffffffffea98,gen_00);
    this_00 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&i,(key_type *)((long)&value.field_2 + 8));
    std::__cxx11::string::operator=
              ((string *)this_00,
               (string *)&ctx._mutex.super___mutex_base._M_mutex.__data.__list.__next);
    std::__cxx11::string::~string
              ((string *)&ctx._mutex.super___mutex_base._M_mutex.__data.__list.__next);
    std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
    gen = extraout_RDX_00;
  }
  rVar3 = std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::operator()
                    ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                     &stack0xffffffffffffea98);
  rVar4 = std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::operator()
                    ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                     &stack0xffffffffffffea98);
  TraceID::TraceID(&local_16b8,rVar3,rVar4);
  rVar3 = std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::operator()
                    ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                     &stack0xffffffffffffea98);
  rVar4 = std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::operator()
                    ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                     &stack0xffffffffffffea98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_16d8,"",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  SpanContext::SpanContext
            ((SpanContext *)local_16a8,&local_16b8,rVar3,rVar4,'\0',(StrMap *)&i,&local_16d8);
  std::__cxx11::string::~string((string *)&local_16d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  BinaryPropagator::inject((BinaryPropagator *)local_1b8,(SpanContext *)local_16a8,local_188);
  BinaryPropagator::extract
            (&local_17a0,(BinaryPropagator *)local_1b8,
             (istream *)
             &binaryPropagator._metrics.
              super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  testing::internal::EqHelper<false>::Compare<jaegertracing::SpanContext,jaegertracing::SpanContext>
            ((EqHelper<false> *)local_16f0,"ctx","binaryPropagator.extract(ss)",
             (SpanContext *)local_16a8,&local_17a0);
  SpanContext::~SpanContext(&local_17a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16f0);
  if (!bVar1) {
    testing::Message::Message(local_17a8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_16f0);
    testing::internal::AssertHelper::AssertHelper
              (local_17b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/propagation/PropagatorTest.cpp"
               ,0x44,pcVar5);
    testing::internal::AssertHelper::operator=(local_17b0,local_17a8);
    testing::internal::AssertHelper::~AssertHelper(local_17b0);
    testing::Message::~Message(local_17a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_16f0);
  SpanContext::~SpanContext((SpanContext *)local_16a8);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&i);
  std::random_device::~random_device((random_device *)&engine);
  BinaryPropagator::~BinaryPropagator((BinaryPropagator *)local_1b8);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)
             &binaryPropagator._metrics.
              super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(Propagator, testBinaryPropagation)
{
    std::stringstream ss;
    BinaryPropagator binaryPropagator;
    std::random_device randomDevice;
    std::default_random_engine engine(randomDevice());
    constexpr auto kMaxNumBaggageItems = 10;
    const auto numBaggageItems = engine() % (kMaxNumBaggageItems - 1) + 1;
    SpanContext::StrMap baggage;
    for (auto i = static_cast<size_t>(0); i < numBaggageItems; ++i) {
        const auto key = randomStr(engine);
        const auto value = randomStr(engine);
        baggage[key] = value;
    }
    SpanContext ctx(
        TraceID(engine(), engine()), engine(), engine(), 0, baggage);
    binaryPropagator.inject(ctx, ss);
    ASSERT_EQ(ctx, binaryPropagator.extract(ss));
}